

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  _Bool _Var1;
  _Bool _Var2;
  uint uVar3;
  CURLMcode CVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  _Bool not_all_paused;
  _Bool unpause_read;
  _Bool keep_changed;
  _Bool recursive;
  int newstate;
  int oldstate;
  CURLcode result;
  SingleRequest *k;
  int action_local;
  Curl_easy *data_local;
  
  newstate = 0;
  if (((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) ||
     (data->conn == (connectdata *)0x0)) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  _Var1 = Curl_is_in_callback(data);
  uVar5 = 0;
  if ((action & 1U) != 0) {
    uVar5 = 0x10;
  }
  uVar6 = 0;
  if ((action & 4U) != 0) {
    uVar6 = 0x20;
  }
  uVar3 = (data->req).keepon & 0xffffffcfU | uVar5 | uVar6;
  bVar7 = (uVar5 | uVar6) != ((data->req).keepon & 0x30U);
  bVar8 = false;
  if ((((data->req).keepon & (uVar3 ^ 0xffffffff) & 0x20) != 0) &&
     (bVar8 = true, data->mstate != MSTATE_PERFORMING)) {
    bVar8 = data->mstate == MSTATE_RATELIMITING;
  }
  (data->req).keepon = uVar3;
  if ((uVar5 | uVar6) != 0x30) {
    Curl_expire(data,0,EXPIRE_RUN_NOW);
    (data->state).keeps_speed.tv_sec = 0;
    if (uVar6 == 0) {
      (data->state).select_bits = (data->state).select_bits | 2;
    }
    if (uVar5 == 0) {
      (data->state).select_bits = (data->state).select_bits | 1;
    }
    if (((bVar7) && (data->multi != (Curl_multi *)0x0)) &&
       (CVar4 = Curl_update_timer(data->multi), CVar4 != CURLM_OK)) {
      newstate = 0x2a;
      goto LAB_001340de;
    }
  }
  if ((((!bVar8) || (newstate = Curl_creader_unpause(data), newstate == CURLE_OK)) &&
      (((data->req).keepon & 0x10U) == 0)) && (_Var2 = Curl_cwriter_is_paused(data), _Var2)) {
    Curl_conn_ev_data_pause(data,false);
    newstate = Curl_cwriter_unpause(data);
  }
LAB_001340de:
  if (((newstate == 0) && ((*(uint *)&(data->state).field_0x774 >> 10 & 1) == 0)) && (bVar7)) {
    newstate = Curl_updatesocket(data);
  }
  if (_Var1) {
    Curl_set_in_callback(data,true);
  }
  return newstate;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;
  bool recursive = FALSE;
  bool keep_changed, unpause_read, not_all_paused;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, do not continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(Curl_is_in_callback(data))
    recursive = TRUE;
  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV) ? KEEP_RECV_PAUSE : 0) |
    ((action & CURLPAUSE_SEND) ? KEEP_SEND_PAUSE : 0);

  keep_changed = ((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) != oldstate);
  not_all_paused = (newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
                   (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE);
  unpause_read = ((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
                  (data->mstate == MSTATE_PERFORMING ||
                   data->mstate == MSTATE_RATELIMITING));
  /* Unpausing writes is detected on the next run in
   * transfer.c:Curl_sendrecv(). This is because this may result
   * in a transfer error if the application's callbacks fail */

  /* Set the new keepon state, so it takes effect no matter what error
   * may happen afterwards. */
  k->keepon = newstate;

  /* If not completely pausing both directions now, run again in any case. */
  if(not_all_paused) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW);
    /* reset the too-slow time keeper */
    data->state.keeps_speed.tv_sec = 0;
    /* Simulate socket events on next run for unpaused directions */
    if(!(newstate & KEEP_SEND_PAUSE))
      data->state.select_bits |= CURL_CSELECT_OUT;
    if(!(newstate & KEEP_RECV_PAUSE))
      data->state.select_bits |= CURL_CSELECT_IN;
    /* On changes, tell application to update its timers. */
    if(keep_changed && data->multi) {
      if(Curl_update_timer(data->multi)) {
        result = CURLE_ABORTED_BY_CALLBACK;
        goto out;
      }
    }
  }

  if(unpause_read) {
    result = Curl_creader_unpause(data);
    if(result)
      goto out;
  }

  if(!(k->keepon & KEEP_RECV_PAUSE) && Curl_cwriter_is_paused(data)) {
    Curl_conn_ev_data_pause(data, FALSE);
    result = Curl_cwriter_unpause(data);
  }

out:
  if(!result && !data->state.done && keep_changed)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    result = Curl_updatesocket(data);

  if(recursive)
    /* this might have called a callback recursively which might have set this
       to false again on exit */
    Curl_set_in_callback(data, TRUE);

  return result;
}